

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O3

MPP_RET mpp_enc_refs_get_cpb_info(MppEncRefs refs,MppEncCpbInfo *info)

{
  byte bVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  RK_S32 RVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  MPP_RET MVar13;
  
  if (refs == (MppEncRefs)0x0 || info == (MppEncCpbInfo *)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid input refs %p info %p\n","mpp_enc_refs_get_cpb_info",refs,
               info);
    MVar13 = MPP_ERR_VALUE;
  }
  else if (((byte)enc_refs_debug & 1) == 0) {
    uVar9 = *(undefined8 *)((long)refs + 0x40);
    uVar10 = *(undefined8 *)((long)refs + 0x48);
    uVar11 = *(undefined8 *)((long)refs + 0x4c);
    uVar12 = *(undefined8 *)((long)refs + 0x54);
    info->max_lt_idx = (int)uVar11;
    info->max_st_tid = (int)((ulong)uVar11 >> 0x20);
    info->lt_gop = (int)uVar12;
    info->st_gop = (int)((ulong)uVar12 >> 0x20);
    info->dpb_size = (int)uVar9;
    info->max_lt_cnt = (int)((ulong)uVar9 >> 0x20);
    info->max_st_cnt = (int)uVar10;
    info->max_lt_idx = (int)((ulong)uVar10 >> 0x20);
    MVar13 = MPP_OK;
  }
  else {
    MVar13 = MPP_OK;
    _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_get_cpb_info",refs);
    bVar1 = (byte)enc_refs_debug & 1;
    RVar2 = *(RK_S32 *)((long)refs + 0x40);
    RVar3 = *(RK_S32 *)((long)refs + 0x44);
    RVar4 = *(RK_S32 *)((long)refs + 0x48);
    RVar5 = *(RK_S32 *)((long)refs + 0x4c);
    RVar6 = *(RK_S32 *)((long)refs + 0x50);
    RVar7 = *(RK_S32 *)((long)refs + 0x54);
    RVar8 = *(RK_S32 *)((long)refs + 0x58);
    info->max_lt_idx = *(RK_S32 *)((long)refs + 0x4c);
    info->max_st_tid = RVar6;
    info->lt_gop = RVar7;
    info->st_gop = RVar8;
    info->dpb_size = RVar2;
    info->max_lt_cnt = RVar3;
    info->max_st_cnt = RVar4;
    info->max_lt_idx = RVar5;
    if (bVar1 != 0) {
      MVar13 = MPP_OK;
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_get_cpb_info",refs);
    }
  }
  return MVar13;
}

Assistant:

MPP_RET mpp_enc_refs_get_cpb_info(MppEncRefs refs, MppEncCpbInfo *info)
{
    if (NULL == refs || NULL == info) {
        mpp_err_f("invalid input refs %p info %p\n", refs, info);
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    memcpy(info, &p->cpb.info, sizeof(*info));

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}